

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

format_decimal_result<char_*>
fmt::v7::detail::format_decimal<char,unsigned_long>(char *out,unsigned_long value,int size)

{
  format_decimal_result<char_*> fVar1;
  char *end;
  int size_local;
  unsigned_long value_local;
  char *out_local;
  char *local_30;
  
  out_local = out + size;
  for (value_local = value; 99 < value_local; value_local = value_local / 100) {
    out_local = out_local + -2;
    *(undefined2 *)out_local = *(undefined2 *)(basic_data<void>::digits + (value_local % 100) * 2);
  }
  if (value_local < 10) {
    local_30 = out_local + -1;
    out_local[-1] = (char)value_local + '0';
  }
  else {
    local_30 = out_local + -2;
    *(undefined2 *)local_30 = *(undefined2 *)(basic_data<void>::digits + value_local * 2);
  }
  fVar1.end = out + size;
  fVar1.begin = local_30;
  return fVar1;
}

Assistant:

inline format_decimal_result<Char*> format_decimal(Char* out, UInt value,
                                                   int size) {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  out += size;
  Char* end = out;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    out -= 2;
    copy2(out, data::digits[value % 100]);
    value /= 100;
  }
  if (value < 10) {
    *--out = static_cast<Char>('0' + value);
    return {out, end};
  }
  out -= 2;
  copy2(out, data::digits[value]);
  return {out, end};
}